

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManCollectRing(Gia_Man_t *p,Vec_Int_t *vStart,Vec_Int_t *vRes,Vec_Int_t *vDists)

{
  int iVar1;
  int iVar2;
  int iObj;
  int *piVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  
  if (0 < vStart->nSize) {
    lVar8 = 0;
    do {
      iVar1 = vStart->pArray[lVar8];
      lVar12 = (long)iVar1;
      if ((lVar12 < 0) || (vDists->nSize <= iVar1)) {
LAB_00246f9b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->nObjs <= iVar1) {
LAB_00246fba:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      iVar2 = vDists->pArray[lVar12];
      if (iVar2 < 1) {
        __assert_fail("Weight > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                      ,0x91c,
                      "void Gia_ManCollectRing(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)")
        ;
      }
      pGVar11 = p->pObjs + lVar12;
      uVar4 = (uint)*(ulong *)pGVar11;
      uVar7 = *(ulong *)pGVar11 & 0x1fffffff;
      if (uVar7 != 0x1fffffff && -1 < (int)uVar4) {
        uVar9 = (uint)*(undefined8 *)(pGVar11 + -uVar7);
        uVar6 = uVar9 & 0x1fffffff;
        Gia_ManRingAdd(p,iVar1 - (uVar4 & 0x1fffffff),vRes,vDists,
                       (uint)(((int)uVar9 < 0 || uVar6 == 0x1fffffff) ||
                             uVar6 != ((uint)((ulong)*(undefined8 *)(pGVar11 + -uVar7) >> 0x20) &
                                      0x1fffffff)) + iVar2);
        uVar4 = (uint)(*(ulong *)pGVar11 >> 0x20);
        uVar9 = (uint)*(undefined8 *)(pGVar11 + -(ulong)(uVar4 & 0x1fffffff));
        uVar6 = uVar9 & 0x1fffffff;
        Gia_ManRingAdd(p,iVar1 - (uVar4 & 0x1fffffff),vRes,vDists,
                       (uint)(((int)uVar9 < 0 || uVar6 == 0x1fffffff) ||
                             uVar6 != ((uint)((ulong)*(undefined8 *)
                                                      (pGVar11 + -(ulong)(uVar4 & 0x1fffffff)) >>
                                             0x20) & 0x1fffffff)) + iVar2);
      }
      pVVar5 = p->vFanoutNums;
      if (pVVar5->nSize <= iVar1) goto LAB_00246f9b;
      iVar10 = 0;
      while (iVar10 < pVVar5->pArray[lVar12]) {
        uVar4 = p->vFanout->nSize;
        if ((int)uVar4 <= iVar1) goto LAB_00246f9b;
        piVar3 = p->vFanout->pArray;
        uVar9 = piVar3[lVar12] + iVar10;
        if (((int)uVar9 < 0) || (uVar4 <= uVar9)) goto LAB_00246f9b;
        iObj = piVar3[uVar9];
        if (((long)iObj < 0) || (p->nObjs <= iObj)) goto LAB_00246fba;
        uVar4 = (uint)*(undefined8 *)(p->pObjs + iObj);
        uVar9 = uVar4 & 0x1fffffff;
        Gia_ManRingAdd(p,iObj,vRes,vDists,
                       (uint)(((int)uVar4 < 0 || uVar9 == 0x1fffffff) ||
                             uVar9 != ((uint)((ulong)*(undefined8 *)(p->pObjs + iObj) >> 0x20) &
                                      0x1fffffff)) + iVar2);
        iVar10 = iVar10 + 1;
        pVVar5 = p->vFanoutNums;
        if (pVVar5->nSize <= iVar1) goto LAB_00246f9b;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vStart->nSize);
  }
  return;
}

Assistant:

void Gia_ManCollectRing( Gia_Man_t * p, Vec_Int_t * vStart, Vec_Int_t * vRes, Vec_Int_t * vDists )
{
    int i, k, iObj, iFan;
    Vec_IntForEachEntry( vStart, iObj, i )
    {
        int Weight = Vec_IntEntry( vDists, iObj );
        Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
        assert( Weight > 0 );
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ManRingAdd( p, Gia_ObjFaninId0(pObj, iObj), vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ObjFanin0(pObj)) );
            Gia_ManRingAdd( p, Gia_ObjFaninId1(pObj, iObj), vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ObjFanin1(pObj)) );
        }
        Gia_ObjForEachFanoutStaticId( p, iObj, iFan, k )
            Gia_ManRingAdd( p, iFan, vRes, vDists, Weight + 1*!Gia_ObjIsBuf(Gia_ManObj(p, iFan)) );
    }
}